

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumFieldGenerator::GenerateMergeFromCodedStream
          (EnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "int value;\nDO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\nif ($type$_IsValid(value)) {\n  set_$name$(static_cast< $type$ >(value));\n"
                    );
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x20) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,variables,
                       "} else {\n  mutable_unknown_fields()->AddVarint($number$, value);\n");
  }
  io::Printer::Print(printer,variables,"}\n");
  return;
}

Assistant:

void EnumFieldGenerator::
GenerateMergeFromCodedStream(io::Printer* printer) const {
  printer->Print(variables_,
    "int value;\n"
    "DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
    "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
    "       input, &value)));\n"
    "if ($type$_IsValid(value)) {\n"
    "  set_$name$(static_cast< $type$ >(value));\n");
  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(variables_,
      "} else {\n"
      "  mutable_unknown_fields()->AddVarint($number$, value);\n");
  }
  printer->Print(variables_,
    "}\n");
}